

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::transposeTransitionMatrices
          (BeagleCPUImpl<float,_1,_0> *this,int *inputIndices,int *resultIndices,int matrixCount)

{
  float *pfVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  float **ppfVar5;
  ulong uVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  
  if (0 < matrixCount) {
    uVar2 = this->kStateCount;
    ppfVar5 = this->gTransitionMatrices;
    iVar3 = this->kCategoryCount;
    uVar12 = 0;
    iVar7 = this->kTransPaddedStateCount * uVar2;
    do {
      if (inputIndices[uVar12] == resultIndices[uVar12]) {
        return -5;
      }
      if (0 < iVar3) {
        pfVar8 = ppfVar5[resultIndices[uVar12]];
        pfVar15 = ppfVar5[inputIndices[uVar12]];
        iVar10 = 0;
        do {
          if (0 < (int)uVar2) {
            iVar4 = this->kTransPaddedStateCount;
            uVar6 = 0;
            pfVar9 = pfVar8;
            pfVar13 = pfVar15;
            do {
              uVar11 = 0;
              pfVar14 = pfVar9;
              do {
                pfVar1 = pfVar13 + uVar11;
                uVar11 = uVar11 + 1;
                *pfVar14 = *pfVar1;
                pfVar14 = pfVar14 + iVar4;
              } while (uVar2 != uVar11);
              uVar6 = uVar6 + 1;
              pfVar9 = pfVar9 + 1;
              pfVar13 = pfVar13 + iVar4;
            } while (uVar6 != uVar2);
          }
          iVar10 = iVar10 + 1;
          pfVar8 = pfVar8 + iVar7;
          pfVar15 = pfVar15 + iVar7;
        } while (iVar10 != iVar3);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)matrixCount);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::transposeTransitionMatrices(
        const int* inputIndices,
        const int* resultIndices,
        int matrixCount) {

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Entering BeagleCPUImpl::transposeTransitionMatrices \n");
#endif

    int returnCode = BEAGLE_SUCCESS;

    for (int u = 0; u < matrixCount; u++) {

        if (inputIndices[u] == resultIndices[u]) {

#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr, "In-place transpose is not allowed.\n");
#endif

            returnCode = BEAGLE_ERROR_OUT_OF_RANGE;
            break;

        }

        REALTYPE* A = gTransitionMatrices[inputIndices[u]];
        REALTYPE* C = gTransitionMatrices[resultIndices[u]];

        for (int l = 0; l < kCategoryCount; l++) {

            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {

                    C[kTransPaddedStateCount * j + i] = A[kTransPaddedStateCount * i + j];

                }
            }

            A += kStateCount * kTransPaddedStateCount;
            C += kStateCount * kTransPaddedStateCount;
        }
    }

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Leaving BeagleCPUImpl::transposeTransitionMatrices \n");
#endif

    return returnCode;
}